

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

void __thiscall google::protobuf::io::StringOutputStream::BackUp(StringOutputStream *this,int count)

{
  Nonnull<const_char_*> pcVar1;
  undefined4 in_register_00000034;
  ulong v2;
  ulong unaff_R14;
  StringOutputStream SStack_28;
  
  v2 = CONCAT44(in_register_00000034,count);
  if (count < 0) {
    v2 = 0;
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)count,0,"count >= 0");
  }
  else {
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar1 != (Nonnull<const_char_*>)0x0) {
    BackUp();
    goto LAB_002ec8b9;
  }
  if (this->target_ == (string *)0x0) {
    BackUp(&SStack_28);
LAB_002ec89d:
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       (unaff_R14,v2,"static_cast<size_t>(count) <= target_->size()");
  }
  else {
    unaff_R14 = (ulong)count;
    v2 = this->target_->_M_string_length;
    if (v2 < unaff_R14) goto LAB_002ec89d;
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    std::__cxx11::string::resize
              ((ulong)this->target_,(char)this->target_->_M_string_length - (char)unaff_R14);
    return;
  }
LAB_002ec8b9:
  BackUp();
}

Assistant:

void StringOutputStream::BackUp(int count) {
  ABSL_CHECK_GE(count, 0);
  ABSL_CHECK(target_ != nullptr);
  ABSL_CHECK_LE(static_cast<size_t>(count), target_->size());
  target_->resize(target_->size() - count);
}